

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_done(connectdata *conn,CURLcode status,_Bool premature)

{
  SessionHandle *pSVar1;
  undefined4 *puVar2;
  imapstate iVar3;
  
  pSVar1 = conn->data;
  puVar2 = (undefined4 *)(pSVar1->req).protop;
  if (puVar2 == (undefined4 *)0x0) {
    return CURLE_OK;
  }
  if (status != CURLE_OK) {
    (conn->bits).close = true;
    goto LAB_001253b9;
  }
  status = CURLE_OK;
  if ((((pSVar1->set).connect_only != false) || (*(long *)(puVar2 + 0xe) != 0)) ||
     ((*(long *)(puVar2 + 6) == 0 && (status = CURLE_OK, (pSVar1->set).upload != true))))
  goto LAB_001253b9;
  iVar3 = IMAP_FETCH_FINAL;
  if ((pSVar1->set).upload == true) {
    status = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","");
    if (status == CURLE_OK) {
      iVar3 = IMAP_APPEND_FINAL;
      goto LAB_001253a2;
    }
  }
  else {
LAB_001253a2:
    (conn->proto).imapc.state = iVar3;
    status = CURLE_OK;
  }
  if (status == CURLE_OK) {
    status = imap_block_statemach(conn);
  }
LAB_001253b9:
  if (*(void **)(puVar2 + 2) != (void *)0x0) {
    (*Curl_cfree)(*(void **)(puVar2 + 2));
    *(undefined8 *)(puVar2 + 2) = 0;
  }
  if (*(void **)(puVar2 + 4) != (void *)0x0) {
    (*Curl_cfree)(*(void **)(puVar2 + 4));
    *(undefined8 *)(puVar2 + 4) = 0;
  }
  if (*(void **)(puVar2 + 6) != (void *)0x0) {
    (*Curl_cfree)(*(void **)(puVar2 + 6));
    *(undefined8 *)(puVar2 + 6) = 0;
  }
  if (*(void **)(puVar2 + 8) != (void *)0x0) {
    (*Curl_cfree)(*(void **)(puVar2 + 8));
    *(undefined8 *)(puVar2 + 8) = 0;
  }
  if (*(void **)(puVar2 + 10) != (void *)0x0) {
    (*Curl_cfree)(*(void **)(puVar2 + 10));
    *(undefined8 *)(puVar2 + 10) = 0;
  }
  if (*(void **)(puVar2 + 0xc) != (void *)0x0) {
    (*Curl_cfree)(*(void **)(puVar2 + 0xc));
    *(undefined8 *)(puVar2 + 0xc) = 0;
  }
  if (*(void **)(puVar2 + 0xe) != (void *)0x0) {
    (*Curl_cfree)(*(void **)(puVar2 + 0xe));
    *(undefined8 *)(puVar2 + 0xe) = 0;
  }
  if (*(void **)(puVar2 + 0x10) != (void *)0x0) {
    (*Curl_cfree)(*(void **)(puVar2 + 0x10));
    *(undefined8 *)(puVar2 + 0x10) = 0;
  }
  *puVar2 = 0;
  return status;
}

Assistant:

static CURLcode imap_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct IMAP *imap = data->req.protop;

  (void)premature;

  if(!imap)
    /* When the easy handle is removed from the multi interface while libcurl
       is still trying to resolve the host name, the IMAP struct is not yet
       initialized. However, the removal action calls Curl_done() which in
       turn calls this function, so we simply return success. */
    return CURLE_OK;

  if(status) {
    connclose(conn, "IMAP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && !imap->custom &&
          (imap->uid || data->set.upload)) {
    /* Handle responses after FETCH or APPEND transfer has finished */
    if(!data->set.upload)
      state(conn, IMAP_FETCH_FINAL);
    else {
      /* End the APPEND command first by sending an empty line */
      result = Curl_pp_sendf(&conn->proto.imapc.pp, "%s", "");
      if(!result)
        state(conn, IMAP_APPEND_FINAL);
    }

    /* Run the state-machine

       TODO: when the multi interface is used, this _really_ should be using
       the imap_multi_statemach function but we have no general support for
       non-blocking DONE operations, not in the multi state machine and with
       Curl_done() invokes on several places in the code!
    */
    if(!result)
      result = imap_block_statemach(conn);
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(imap->mailbox);
  Curl_safefree(imap->uidvalidity);
  Curl_safefree(imap->uid);
  Curl_safefree(imap->section);
  Curl_safefree(imap->partial);
  Curl_safefree(imap->query);
  Curl_safefree(imap->custom);
  Curl_safefree(imap->custom_params);

  /* Clear the transfer mode for the next request */
  imap->transfer = FTPTRANSFER_BODY;

  return result;
}